

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O0

EVP_SIGNATURE * evp_signature_new(OSSL_PROVIDER *prov)

{
  EVP_SIGNATURE *prov_00;
  CRYPTO_RWLOCK *pCVar1;
  OSSL_PROVIDER *in_RDI;
  EVP_SIGNATURE *signature;
  char *in_stack_fffffffffffffff8;
  int line;
  
  prov_00 = (EVP_SIGNATURE *)
            CRYPTO_zalloc((size_t)signature,in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
  line = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (prov_00 == (EVP_SIGNATURE *)0x0) {
    ERR_new();
    ERR_set_debug((char *)signature,line,(char *)in_RDI);
    ERR_set_error(6,0xc0100,(char *)0x0);
    prov_00 = (EVP_SIGNATURE *)0x0;
  }
  else {
    pCVar1 = CRYPTO_THREAD_lock_new();
    prov_00->lock = pCVar1;
    if (prov_00->lock == (CRYPTO_RWLOCK *)0x0) {
      ERR_new();
      ERR_set_debug((char *)signature,line,(char *)in_RDI);
      ERR_set_error(6,0xc0100,(char *)0x0);
      CRYPTO_free(prov_00);
      prov_00 = (EVP_SIGNATURE *)0x0;
    }
    else {
      prov_00->prov = in_RDI;
      ossl_provider_up_ref((OSSL_PROVIDER *)prov_00);
      LOCK();
      prov_00->refcnt = 1;
      UNLOCK();
    }
  }
  return prov_00;
}

Assistant:

static EVP_SIGNATURE *evp_signature_new(OSSL_PROVIDER *prov)
{
    EVP_SIGNATURE *signature = OPENSSL_zalloc(sizeof(EVP_SIGNATURE));

    if (signature == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    signature->lock = CRYPTO_THREAD_lock_new();
    if (signature->lock == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        OPENSSL_free(signature);
        return NULL;
    }
    signature->prov = prov;
    ossl_provider_up_ref(prov);
    signature->refcnt = 1;

    return signature;
}